

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogBuffers.cpp
# Opt level: O3

void __thiscall aeron::LogBuffers::LogBuffers(LogBuffers *this,char *filename)

{
  int32_t termLength;
  int32_t pageSize;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  size_t sVar1;
  long lVar2;
  int64_t iVar3;
  uint8_t *puVar4;
  MemoryMappedFile local_38;
  
  this->_vptr_LogBuffers = (_func_int **)&PTR__LogBuffers_00163aa0;
  (this->m_memoryMappedFiles).
  super___shared_ptr<aeron::util::MemoryMappedFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_memoryMappedFiles).
  super___shared_ptr<aeron::util::MemoryMappedFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  lVar2 = 0;
  do {
    *(undefined ***)((long)&this->m_buffers[0]._vptr_AtomicBuffer + lVar2) =
         &PTR__AtomicBuffer_00163200;
    *(undefined8 *)((long)&this->m_buffers[0].m_buffer + lVar2) = 0;
    *(undefined4 *)((long)&this->m_buffers[0].m_length + lVar2) = 0;
    lVar2 = lVar2 + 0x18;
  } while (lVar2 != 0x60);
  iVar3 = util::MemoryMappedFile::getFileSize(filename);
  util::MemoryMappedFile::mapExisting(&local_38,filename);
  sVar1 = local_38.m_memorySize;
  puVar4 = local_38.m_memory;
  local_38.m_memory = (uint8_t *)0x0;
  local_38.m_memorySize = 0;
  this_00 = (this->m_memoryMappedFiles).
            super___shared_ptr<aeron::util::MemoryMappedFile,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->m_memoryMappedFiles).
  super___shared_ptr<aeron::util::MemoryMappedFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)puVar4;
  (this->m_memoryMappedFiles).
  super___shared_ptr<aeron::util::MemoryMappedFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar1;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38.m_memorySize !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38.m_memorySize);
    }
  }
  puVar4 = util::MemoryMappedFile::getMemoryPtr
                     ((this->m_memoryMappedFiles).
                      super___shared_ptr<aeron::util::MemoryMappedFile,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
  this->m_buffers[3].m_buffer = puVar4 + iVar3 + -0x1000;
  this->m_buffers[3].m_length = 0x1000;
  termLength = *(int32_t *)(puVar4 + iVar3 + -0xeec);
  pageSize = *(int32_t *)(puVar4 + iVar3 + -0xee8);
  concurrent::logbuffer::LogBufferDescriptor::checkTermLength(termLength);
  concurrent::logbuffer::LogBufferDescriptor::checkPageSize(pageSize);
  lVar2 = 0x28;
  do {
    *(uint8_t **)((long)this->m_buffers + lVar2 + -0x20) = puVar4;
    *(int32_t *)((long)&((LogBuffers *)(this->m_buffers + -1))->_vptr_LogBuffers + lVar2) =
         termLength;
    puVar4 = puVar4 + termLength;
    lVar2 = lVar2 + 0x18;
  } while (lVar2 != 0x70);
  return;
}

Assistant:

LogBuffers::LogBuffers(const char *filename)
{
    const std::int64_t logLength = MemoryMappedFile::getFileSize(filename);

    m_memoryMappedFiles = MemoryMappedFile::mapExisting(filename);

    std::uint8_t *basePtr = m_memoryMappedFiles->getMemoryPtr();

    m_buffers[LogBufferDescriptor::LOG_META_DATA_SECTION_INDEX]
        .wrap(basePtr + (logLength - LogBufferDescriptor::LOG_META_DATA_LENGTH),
            LogBufferDescriptor::LOG_META_DATA_LENGTH);

    const std::int32_t termLength = LogBufferDescriptor::termLength(
        m_buffers[LogBufferDescriptor::LOG_META_DATA_SECTION_INDEX]);
    const std::int32_t pageSize = LogBufferDescriptor::pageSize(
        m_buffers[LogBufferDescriptor::LOG_META_DATA_SECTION_INDEX]);

    LogBufferDescriptor::checkTermLength(termLength);
    LogBufferDescriptor::checkPageSize(pageSize);

    for (int i = 0; i < LogBufferDescriptor::PARTITION_COUNT; i++)
    {
        m_buffers[i].wrap(basePtr + (i * termLength), termLength);
    }
}